

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prwlock_test.cpp
# Opt level: O2

void * reader_thread_func(void *data)

{
  int iVar1;
  int iVar2;
  
  while( true ) {
    iVar1 = p_atomic_int_get(&writers_counter);
    if (iVar1 != 0) break;
    p_uthread_sleep(10);
  }
  iVar1 = 0;
  while (is_threads_working == 1) {
    p_uthread_sleep(10);
    iVar2 = p_rwlock_reader_trylock(test_rwlock);
    if (iVar2 == 0) {
      iVar2 = p_rwlock_reader_lock(test_rwlock);
      if (iVar2 == 0) {
        p_uthread_exit(0xffffffff);
      }
    }
    iVar2 = bcmp(string_buf,"This is a test string.",0x17);
    if (iVar2 != 0) {
      iVar2 = bcmp(string_buf,"Ouh, yet another string to check!",0x22);
      if (iVar2 != 0) {
        p_rwlock_reader_unlock(test_rwlock);
        p_uthread_exit(0xffffffff);
      }
    }
    iVar2 = p_rwlock_reader_unlock(test_rwlock);
    if (iVar2 == 0) {
      p_uthread_exit(0xffffffff);
    }
    iVar1 = iVar1 + 1;
  }
  p_uthread_exit(iVar1);
  return (void *)0x0;
}

Assistant:

static void * reader_thread_func (void *data)
{
	P_UNUSED (data);

	pint counter = 0;

	while (p_atomic_int_get (&writers_counter) == 0)
		p_uthread_sleep (10);

	while (is_threads_working == TRUE) {
		p_uthread_sleep (10);

		if (p_rwlock_reader_trylock (test_rwlock) == FALSE) {
			if (p_rwlock_reader_lock (test_rwlock) == FALSE)
				p_uthread_exit (-1);
		}

		if (strcmp (string_buf, PRWLOCK_TEST_STRING_1) != 0 &&
		    strcmp (string_buf, PRWLOCK_TEST_STRING_2) != 0) {
			p_rwlock_reader_unlock (test_rwlock);
			p_uthread_exit (-1);
		}

		if (p_rwlock_reader_unlock (test_rwlock) == FALSE)
			p_uthread_exit (-1);

		++counter;
	}

	p_uthread_exit (counter);

	return NULL;
}